

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigOper.c
# Opt level: O2

Aig_Obj_t * Aig_Multi_rec(Aig_Man_t *p,Aig_Obj_t **ppObjs,int nObjs,Aig_Type_t Type)

{
  int nObjs_00;
  Aig_Obj_t *pAVar1;
  Aig_Obj_t *p1;
  
  if (nObjs == 1) {
    return *ppObjs;
  }
  nObjs_00 = nObjs / 2;
  pAVar1 = Aig_Multi_rec(p,ppObjs,nObjs_00,Type);
  p1 = Aig_Multi_rec(p,ppObjs + nObjs_00,nObjs - nObjs_00,Type);
  pAVar1 = Aig_Oper(p,pAVar1,p1,Type);
  return pAVar1;
}

Assistant:

Aig_Obj_t * Aig_Multi_rec( Aig_Man_t * p, Aig_Obj_t ** ppObjs, int nObjs, Aig_Type_t Type )
{
    Aig_Obj_t * pObj1, * pObj2;
    if ( nObjs == 1 )
        return ppObjs[0];
    pObj1 = Aig_Multi_rec( p, ppObjs,           nObjs/2,         Type );
    pObj2 = Aig_Multi_rec( p, ppObjs + nObjs/2, nObjs - nObjs/2, Type );
    return Aig_Oper( p, pObj1, pObj2, Type );
}